

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_Teleport
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double dVar1;
  DObject *this;
  ulong uVar2;
  ulong uVar3;
  byte bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  PClassActor *pPVar9;
  AActor *this_00;
  DSpotState *this_01;
  ASpecialSpot *pAVar10;
  double *pdVar11;
  AActor *pAVar12;
  uint uVar13;
  char *pcVar14;
  AActor *origin;
  undefined4 uVar15;
  undefined4 uVar16;
  double dVar17;
  int local_bc;
  PClassActor *local_b8;
  FState *local_a8;
  double local_a0;
  double local_98;
  FName local_8c;
  DVector3 local_88;
  DVector3 local_68;
  DVector3 local_48;
  
  if (numparam < 1) {
LAB_003e9f3e:
    pcVar14 = "(paramnum) < numparam";
LAB_003e9f79:
    __assert_fail(pcVar14,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1378,
                  "int AF_AActor_A_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003e9f35:
    pcVar14 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_003e9f79;
  }
  origin = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (origin == (AActor *)0x0) goto LAB_003e98f3;
    bVar5 = DObject::IsKindOf((DObject *)origin,AActor::RegistrationInfo.MyClass);
    if (!bVar5) {
      pcVar14 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003e9f79;
    }
  }
  else {
    if (origin != (AActor *)0x0) goto LAB_003e9f35;
LAB_003e98f3:
    origin = (AActor *)0x0;
  }
  if (numparam == 1) goto LAB_003e9f3e;
  if (param[1].field_0.field_3.Type != '\x03') goto LAB_003e9f35;
  this = (DObject *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if ((this != (DObject *)0x0) &&
       (bVar5 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass), !bVar5)) {
      pcVar14 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003e9f79;
    }
  }
  else if (this != (DObject *)0x0) goto LAB_003e9f35;
  if ((uint)numparam < 3) goto LAB_003e9f3e;
  if (param[2].field_0.field_3.Type != '\x03') {
    pcVar14 = "param[paramnum].Type == REGT_POINTER";
    goto LAB_003e9f79;
  }
  if (numparam == 3) {
    if (defaultparam->Array[3].field_0.field_3.Type != '\0') {
      pcVar14 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003ea01d:
      __assert_fail(pcVar14,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1379,
                    "int AF_AActor_A_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    iVar8 = defaultparam->Array[3].field_0.i;
    pPVar9 = (PClassActor *)DObject::GetClass((DObject *)origin);
    local_a8 = FStateLabelStorage::GetState(&StateLabels,iVar8,pPVar9,false);
LAB_003e99ee:
    param = defaultparam->Array;
    if (param[4].field_0.field_3.Type != '\x03') {
LAB_003e9f66:
      pcVar14 = 
      "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
      ;
LAB_003ea03c:
      __assert_fail(pcVar14,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x137a,
                    "int AF_AActor_A_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pPVar9 = (PClassActor *)param[4].field_0.field_1.a;
    if (param[4].field_0.field_1.atag != 1) {
      if (pPVar9 != (PClassActor *)0x0) goto LAB_003e9f66;
      pPVar9 = (PClassActor *)0x0;
    }
LAB_003e9a15:
    if (param[5].field_0.field_3.Type != '\x03') {
LAB_003e9f47:
      pcVar14 = 
      "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
      ;
LAB_003e9f4e:
      __assert_fail(pcVar14,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x137b,
                    "int AF_AActor_A_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    local_b8 = (PClassActor *)param[5].field_0.field_1.a;
    if (param[5].field_0.field_1.atag != 1) {
      if (local_b8 != (PClassActor *)0x0) goto LAB_003e9f47;
      local_b8 = (PClassActor *)0x0;
    }
LAB_003e9a34:
    if (param[6].field_0.field_3.Type != '\0') {
      pcVar14 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e9ff5:
      __assert_fail(pcVar14,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x137c,
                    "int AF_AActor_A_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    uVar13 = param[6].field_0.i;
LAB_003e9a41:
    if (param[7].field_0.field_3.Type != '\x01') {
      pcVar14 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003e9fd6:
      __assert_fail(pcVar14,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x137d,
                    "int AF_AActor_A_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    uVar15 = (undefined4)*(undefined8 *)&param[7].field_0;
    uVar16 = (undefined4)((ulong)*(undefined8 *)&param[7].field_0 >> 0x20);
LAB_003e9a50:
    if (param[8].field_0.field_3.Type != '\x01') {
      pcVar14 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003e9fb7:
      __assert_fail(pcVar14,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x137e,
                    "int AF_AActor_A_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    local_a0 = param[8].field_0.f;
LAB_003e9a6b:
    local_98 = (double)CONCAT44(uVar16,uVar15);
    if (param[9].field_0.field_3.Type != '\0') {
      pcVar14 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e9f98:
      __assert_fail(pcVar14,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x137f,
                    "int AF_AActor_A_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
  }
  else {
    if (param[3].field_0.field_3.Type != '\0') {
      pcVar14 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003ea01d;
    }
    iVar8 = param[3].field_0.i;
    pPVar9 = (PClassActor *)DObject::GetClass((DObject *)origin);
    local_a8 = FStateLabelStorage::GetState(&StateLabels,iVar8,pPVar9,false);
    if ((uint)numparam < 5) goto LAB_003e99ee;
    if ((param[4].field_0.field_3.Type != '\x03') ||
       (pPVar9 = (PClassActor *)param[4].field_0.field_1.a,
       pPVar9 != (PClassActor *)0x0 && param[4].field_0.field_1.atag != 1)) {
      pcVar14 = 
      "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
      ;
      goto LAB_003ea03c;
    }
    if (numparam == 5) {
      param = defaultparam->Array;
      goto LAB_003e9a15;
    }
    if ((param[5].field_0.field_3.Type != '\x03') ||
       (local_b8 = (PClassActor *)param[5].field_0.field_1.a,
       local_b8 != (PClassActor *)0x0 && param[5].field_0.field_1.atag != 1)) {
      pcVar14 = 
      "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
      ;
      goto LAB_003e9f4e;
    }
    if ((uint)numparam < 7) {
      param = defaultparam->Array;
      goto LAB_003e9a34;
    }
    if (param[6].field_0.field_3.Type != '\0') {
      pcVar14 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003e9ff5;
    }
    uVar13 = param[6].field_0.i;
    if (numparam == 7) {
      param = defaultparam->Array;
      goto LAB_003e9a41;
    }
    if (param[7].field_0.field_3.Type != '\x01') {
      pcVar14 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003e9fd6;
    }
    local_98 = *(double *)&param[7].field_0;
    uVar15 = SUB84(local_98,0);
    uVar16 = (undefined4)((ulong)local_98 >> 0x20);
    if ((uint)numparam < 9) {
      param = defaultparam->Array;
      goto LAB_003e9a50;
    }
    if (param[8].field_0.field_3.Type != '\x01') {
      pcVar14 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003e9fb7;
    }
    local_a0 = param[8].field_0.f;
    if (numparam == 9) {
      param = defaultparam->Array;
      goto LAB_003e9a6b;
    }
    if (param[9].field_0.field_3.Type != '\0') {
      pcVar14 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003e9f98;
    }
  }
  this_00 = COPY_AAPTR(origin,param[9].field_0.i);
  if (numret < 2) {
    if (numret == 1) {
      local_bc = 1;
      goto LAB_003e9ab8;
    }
    bVar5 = false;
    local_bc = numret;
  }
  else {
    VMReturn::SetInt(ret + 1,0);
    local_bc = 2;
LAB_003e9ab8:
    VMReturn::SetPointer(ret,(void *)0x0,0);
    bVar5 = true;
  }
  if (this_00 == (AActor *)0x0) {
    return local_bc;
  }
  if ((((this_00->flags2).Value & 0x80) != 0) && ((uVar13 & 0x400) == 0)) {
    return local_bc;
  }
  if ((uVar13 & 2) != 0) {
    iVar8 = this_00->health;
    iVar7 = AActor::SpawnHealth(this_00);
    if (iVar7 + 7U < 0xf) {
      iVar7 = 1;
    }
    else {
      iVar7 = AActor::SpawnHealth(this_00);
      iVar7 = iVar7 / 8;
    }
    uVar2 = (long)iVar8 / (long)iVar7;
    uVar3 = 8;
    if ((uint)uVar2 < 8) {
      uVar3 = uVar2;
    }
    iVar8 = FRandom::operator()(&pr_teleport);
    if (AF_AActor_A_Teleport::chance[uVar3 & 0xffffffff] <= iVar8) {
      return local_bc;
    }
  }
  this_01 = DSpotState::GetSpotState(true);
  if (this_01 == (DSpotState *)0x0) {
    return local_bc;
  }
  if (pPVar9 == (PClassActor *)0x0) {
    pPVar9 = PClass::FindActor("BossSpot");
  }
  pAVar10 = DSpotState::GetSpotWithMinMaxDistance
                      (this_01,pPVar9,(this_00->__Pos).X,(this_00->__Pos).Y,local_98,local_a0);
  if (pAVar10 == (ASpecialSpot *)0x0) {
    return local_bc;
  }
  if ((uVar13 >> 0xb & 1) == 0) {
    dVar17 = (pAVar10->super_AActor).floorz;
    uVar15 = SUB84(dVar17,0);
    uVar16 = (undefined4)((ulong)dVar17 >> 0x20);
    dVar17 = (pAVar10->super_AActor).ceilingz;
  }
  else {
    pdVar11 = &(pAVar10->super_AActor).__Pos.Z;
    if ((uVar13 & 0x20) == 0) {
      pdVar11 = &(pAVar10->super_AActor).floorz;
    }
    dVar17 = (pAVar10->super_AActor).ceilingz;
    if (dVar17 < this_00->Height + *pdVar11) {
      return local_bc;
    }
    dVar1 = (pAVar10->super_AActor).floorz;
    uVar15 = SUB84(dVar1,0);
    uVar16 = (undefined4)((ulong)dVar1 >> 0x20);
    if (*pdVar11 < dVar1) {
      return local_bc;
    }
  }
  local_48.Z = (double)CONCAT44(uVar16,uVar15);
  local_88.X = (this_00->__Pos).X;
  local_88.Y = (this_00->__Pos).Y;
  local_88.Z = (this_00->__Pos).Z;
  dVar1 = (pAVar10->super_AActor).__Pos.Z;
  if ((pAVar10->super_AActor).Height + dVar1 <= dVar17) {
    if ((double)CONCAT44(uVar16,uVar15) < dVar1 || (double)CONCAT44(uVar16,uVar15) == dVar1) {
      local_48.Z = (double)CONCAT44(uVar16,uVar15) + (dVar1 - (double)CONCAT44(uVar16,uVar15));
    }
  }
  else {
    local_48.Z = dVar17 - this_00->Height;
  }
  local_48.X = (pAVar10->super_AActor).__Pos.X;
  local_48.Y = (pAVar10->super_AActor).__Pos.Y;
  bVar4 = (byte)uVar13;
  bVar6 = P_TeleportMove(this_00,&local_48,(bool)(bVar4 & 1),true);
  if ((bVar6) || ((uVar13 & 4) == 0)) {
    iVar8 = 0;
    if (!bVar6) goto LAB_003e9f0c;
  }
  else {
    AActor::SetOrigin(this_00,&local_48,false);
  }
  if ((local_b8 != (PClassActor *)0x0) || ((uVar13 & 0x100) != 0)) {
    if ((uVar13 & 0x40) == 0) {
      if ((uVar13 >> 8 & 1) == 0) {
        pAVar12 = Spawn(local_b8,&local_88,ALLOW_REPLACE);
        if (pAVar12 != (AActor *)0x0) {
          (pAVar12->target).field_0.p = this_00;
        }
        goto LAB_003e9dc7;
      }
      P_SpawnTeleportFog(this_00,&local_88,true,true);
      if ((char)bVar4 < '\0') goto LAB_003e9e75;
LAB_003e9e50:
      local_68.X = (this_00->__Pos).X;
      local_68.Y = (this_00->__Pos).Y;
      local_68.Z = (this_00->__Pos).Z;
      P_SpawnTeleportFog(this_00,&local_68,false,true);
    }
    else {
LAB_003e9dc7:
      if (-1 < (char)bVar4) {
        if ((uVar13 >> 8 & 1) != 0) goto LAB_003e9e50;
        local_68.X = (this_00->__Pos).X;
        local_68.Y = (this_00->__Pos).Y;
        local_68.Z = (this_00->__Pos).Z;
        pAVar12 = Spawn(local_b8,&local_68,ALLOW_REPLACE);
        if (pAVar12 != (AActor *)0x0) {
          (pAVar12->target).field_0.p = this_00;
        }
      }
    }
  }
LAB_003e9e75:
  pdVar11 = &(pAVar10->super_AActor).__Pos.Z;
  if ((uVar13 & 0x20) == 0) {
    pdVar11 = &this_00->floorz;
  }
  (this_00->__Pos).Z = *pdVar11;
  if ((uVar13 & 0x10) == 0) {
    (this_00->Angles).Yaw.Degrees = (pAVar10->super_AActor).Angles.Yaw.Degrees;
  }
  if ((uVar13 & 8) == 0) {
    (this_00->Vel).X = 0.0;
    (this_00->Vel).Y = 0.0;
    (this_00->Vel).Z = 0.0;
  }
  iVar8 = 1;
  if ((uVar13 >> 9 & 1) == 0) {
    if (local_a8 == (FState *)0x0) {
      FName::FName(&local_8c,"Teleport");
      local_a8 = AActor::FindState(origin,&local_8c);
      if (local_a8 == (FState *)0x0) {
        return local_bc;
      }
    }
    if (!bVar5) {
      return local_bc;
    }
    VMReturn::SetPointer(ret,local_a8,0);
    return local_bc;
  }
LAB_003e9f0c:
  if (1 < local_bc) {
    VMReturn::SetInt(ret + 1,iVar8);
  }
  return local_bc;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Teleport)
{
	PARAM_ACTION_PROLOGUE(AActor);
	PARAM_STATE_DEF		(teleport_state)			
	PARAM_CLASS_DEF		(target_type, ASpecialSpot)	
	PARAM_CLASS_DEF		(fog_type, AActor)			
	PARAM_INT_DEF		(flags)						
	PARAM_FLOAT_DEF		(mindist)					
	PARAM_FLOAT_DEF		(maxdist)					
	PARAM_INT_DEF		(ptr)						

	AActor *ref = COPY_AAPTR(self, ptr);

	// A_Teleport and A_Warp were the only codepointers that can state jump
	// *AND* have a meaningful inventory state chain result. Grrr.
	if (numret > 1)
	{
		ret[1].SetInt(false);
		numret = 2;
	}
	if (numret > 0)
	{
		ret[0].SetPointer(NULL, ATAG_STATE);
	}

	if (!ref)
	{
		return numret;
	}

	if ((ref->flags2 & MF2_NOTELEPORT) && !(flags & TF_OVERRIDE))
	{
		return numret;
	}

	// Randomly choose not to teleport like A_Srcr2Decide.
	if (flags & TF_RANDOMDECIDE)
	{
		static const int chance[] =
		{
			192, 120, 120, 120, 64, 64, 32, 16, 0
		};

		unsigned int chanceindex = ref->health / ((ref->SpawnHealth()/8 == 0) ? 1 : ref->SpawnHealth()/8);

		if (chanceindex >= countof(chance))
		{
			chanceindex = countof(chance) - 1;
		}

		if (pr_teleport() >= chance[chanceindex])
		{
			return numret;
		}
	}

	DSpotState *state = DSpotState::GetSpotState();
	if (state == NULL)
	{
		return numret;
	}

	if (target_type == NULL)
	{
		target_type = PClass::FindActor("BossSpot");
	}

	AActor *spot = state->GetSpotWithMinMaxDistance(target_type, ref->X(), ref->Y(), mindist, maxdist);
	if (spot == NULL)
	{
		return numret;
	}

	// [MC] By default, the function adjusts the actor's Z if it's below the floor or above the ceiling.
	// This can be an issue as actors designed to maintain specific z positions wind up teleporting
	// anyway when they should not, such as a floor rising above or ceiling lowering below the position
	// of the spot.
	if (flags & TF_SENSITIVEZ)
	{
		double posz = (flags & TF_USESPOTZ) ? spot->Z() : spot->floorz;
		if ((posz + ref->Height > spot->ceilingz) || (posz < spot->floorz))
		{
			return numret;
		}
	}
	DVector3 prev = ref->Pos();
	double aboveFloor = spot->Z() - spot->floorz;
	double finalz = spot->floorz + aboveFloor;

	if (spot->Top() > spot->ceilingz)
		finalz = spot->ceilingz - ref->Height;
	else if (spot->Z() < spot->floorz)
		finalz = spot->floorz;

	DVector3 tpos = spot->PosAtZ(finalz);

	//Take precedence and cooperate with telefragging first.
	bool tele_result = P_TeleportMove(ref, tpos, !!(flags & TF_TELEFRAG));

	if (!tele_result && (flags & TF_FORCED))
	{
		//If for some reason the original move didn't work, regardless of telefrag, force it to move.
		ref->SetOrigin(tpos, false);
		tele_result = true;
	}

	AActor *fog1 = NULL, *fog2 = NULL;
	if (tele_result)
	{
		//If a fog type is defined in the parameter, or the user wants to use the actor's predefined fogs,
		//and if there's no desire to be fogless, spawn a fog based upon settings.
		if (fog_type || (flags & TF_USEACTORFOG))
		{ 
			if (!(flags & TF_NOSRCFOG))
			{
				if (flags & TF_USEACTORFOG)
					P_SpawnTeleportFog(ref, prev, true, true);
				else
				{
					fog1 = Spawn(fog_type, prev, ALLOW_REPLACE);
					if (fog1 != NULL)
						fog1->target = ref;
				}
			}
			if (!(flags & TF_NODESTFOG))
			{
				if (flags & TF_USEACTORFOG)
					P_SpawnTeleportFog(ref, ref->Pos(), false, true);
				else
				{
					fog2 = Spawn(fog_type, ref->Pos(), ALLOW_REPLACE);
					if (fog2 != NULL)
						fog2->target = ref;
				}
			}
		}
		
		ref->SetZ((flags & TF_USESPOTZ) ? spot->Z() : ref->floorz, false);

		if (!(flags & TF_KEEPANGLE))
			ref->Angles.Yaw = spot->Angles.Yaw;

		if (!(flags & TF_KEEPVELOCITY)) ref->Vel.Zero();

		if (!(flags & TF_NOJUMP)) //The state jump should only happen with the calling actor.
		{
			if (teleport_state == NULL)
			{
				// Default to Teleport.
				teleport_state = self->FindState("Teleport");
				// If still nothing, then return.
				if (teleport_state == NULL)
				{
					return numret;
				}
			}
			if (numret > 0)
			{
				ret[0].SetPointer(teleport_state, ATAG_STATE);
			}
			return numret;
		}
	}
	if (numret > 1)
	{
		ret[1].SetInt(tele_result);
	}
	return numret;
}